

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuf.h
# Opt level: O0

_Bool ringbuf_pop(ringbuf *b,ringbuf_visitor v,void *u)

{
  short *psVar1;
  undefined8 in_RDX;
  code *in_RSI;
  short *in_RDI;
  uint16_t idx;
  uint16_t sz;
  ringbuf_msgbuf *msg;
  ushort local_2c;
  short local_2a;
  _Bool local_1;
  
  if (*in_RDI == 0) {
    local_1 = false;
  }
  else {
    local_2c = in_RDI[1];
    for (local_2a = *in_RDI; local_2a != 0; local_2a = local_2a + -1) {
      if (local_2c == 0) {
        local_2c = 0x17;
      }
      else {
        local_2c = local_2c - 1;
      }
    }
    psVar1 = in_RDI + (ulong)local_2c * 0x8001 + 2;
    (*in_RSI)(psVar1 + 1,*psVar1,in_RDX,CONCAT62((int6)((ulong)psVar1 >> 0x10),*psVar1));
    *in_RDI = *in_RDI + -1;
    local_1 = true;
  }
  return local_1;
}

Assistant:

static inline bool ringbuf_pop(struct ringbuf * b, ringbuf_visitor v, void * u)
{
  if(b->sz == 0) return false;
  struct ringbuf_msgbuf * msg;
  uint16_t sz = b->sz;
  uint16_t idx = b->idx;
  while(sz)
  {
    if(idx)
      idx = idx - 1;
    else
      idx = RINGBUF_BUFF_SZ - 1;
    sz--; 
  }
  msg = &b->buffs[idx];
  v(msg->buf, msg->sz, u);
  b->sz --;
  return true;
}